

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O3

void __thiscall wasm::TypeUpdater::maybeUpdateTypeToUnreachable(TypeUpdater *this,Block *curr)

{
  mapped_type *pmVar1;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id < 2) {
    return;
  }
  if (((curr->name).super_IString.str._M_str != (char *)0x0) &&
     (pmVar1 = std::
               map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
               ::operator[](&this->blockInfos,&curr->name), 0 < pmVar1->numBreaks)) {
    return;
  }
  makeBlockUnreachableIfNoFallThrough(this,curr);
  return;
}

Assistant:

void maybeUpdateTypeToUnreachable(Block* curr) {
    if (!curr->type.isConcrete()) {
      return; // nothing concrete to change to unreachable
    }
    if (curr->name.is() && blockInfos[curr->name].numBreaks > 0) {
      return; // has a break, not unreachable
    }
    // look for a fallthrough
    makeBlockUnreachableIfNoFallThrough(curr);
  }